

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  Arena *pAVar1;
  Message *to;
  Type *new_result;
  Arena *arena;
  Type *result;
  RepeatedPtrFieldBase *this_local;
  undefined8 local_10;
  
  local_10 = UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                       (this);
  pAVar1 = GetArenaNoVirtual(this);
  if (pAVar1 != (Arena *)0x0) {
    to = GenericTypeHandler<google::protobuf::Message>::NewFromPrototype(local_10,(Arena *)0x0);
    GenericTypeHandler<google::protobuf::Message>::Merge(local_10,to);
    local_10 = to;
  }
  return local_10;
}

Assistant:

inline typename TypeHandler::Type*
RepeatedPtrFieldBase::ReleaseLastInternal(google::protobuf::internal::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArenaNoVirtual();
  if (arena == NULL) {
    return result;
  } else {
    typename TypeHandler::Type* new_result =
        TypeHandler::NewFromPrototype(result, NULL);
    TypeHandler::Merge(*result, new_result);
    return new_result;
  }
}